

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O3

TestInstance * __thiscall
vkt::
InstanceFactory1<vkt::FunctionInstance1<vkt::memory::(anonymous_namespace)::TestConfig>,_vkt::FunctionInstance1<vkt::memory::(anonymous_namespace)::TestConfig>::Args,_vkt::NoPrograms1<vkt::FunctionInstance1<vkt::memory::(anonymous_namespace)::TestConfig>::Args>_>
::createInstance(InstanceFactory1<vkt::FunctionInstance1<vkt::memory::(anonymous_namespace)::TestConfig>,_vkt::FunctionInstance1<vkt::memory::(anonymous_namespace)::TestConfig>::Args,_vkt::NoPrograms1<vkt::FunctionInstance1<vkt::memory::(anonymous_namespace)::TestConfig>::Args>_>
                 *this,Context *context)

{
  Context *pCVar1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  TestInstance *pTVar4;
  
  pTVar4 = (TestInstance *)operator_new(0x70);
  pTVar4->m_context = context;
  pTVar4->_vptr_TestInstance = (_func_int **)&PTR__FunctionInstance1_00cf89a0;
  pTVar4[1]._vptr_TestInstance = (_func_int **)(this->m_arg0).func;
  pCVar1 = (Context *)(this->m_arg0).arg0.allocationSize;
  pp_Var2 = *(_func_int ***)&(this->m_arg0).arg0.seed;
  pp_Var3 = (_func_int **)(this->m_arg0).arg0.mapping.size;
  pTVar4[2].m_context = (Context *)(this->m_arg0).arg0.mapping.offset;
  pTVar4[3]._vptr_TestInstance = pp_Var3;
  pTVar4[1].m_context = pCVar1;
  pTVar4[2]._vptr_TestInstance = pp_Var2;
  std::
  vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ::vector((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
            *)&pTVar4[3].m_context,&(this->m_arg0).arg0.flushMappings);
  std::
  vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ::vector((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
            *)(pTVar4 + 5),&(this->m_arg0).arg0.invalidateMappings);
  *(bool *)&pTVar4[6].m_context = (this->m_arg0).arg0.remap;
  return pTVar4;
}

Assistant:

TestInstance*	createInstance		(Context& context) const { return new Instance(context, m_arg0); }